

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TSPStateImp.cpp
# Opt level: O1

void __thiscall
TSPStateImp::PrintSolution(TSPStateImp *this,vector<int,_std::allocator<int>_> *state)

{
  ostream *poVar1;
  int *piVar2;
  char local_29;
  
  local_29 = '\t';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_29,1);
  piVar2 = (state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if (piVar2 != (state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
    do {
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      piVar2 = piVar2 + 1;
    } while (piVar2 != (state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  return;
}

Assistant:

void TSPStateImp::PrintSolution(std::vector<int> *state)
{
	std::cout << '\t';
	for (auto iter = state->begin(); iter != state->end(); ++iter)
		std::cout << *iter << " ";
	std::cout << std::endl;

}